

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_compress_stdin_open(char *filename,int rwmode,int *hdl)

{
  char *pcVar1;
  char *ptr;
  int status;
  int *hdl_local;
  int rwmode_local;
  char *filename_local;
  
  if (rwmode == 0) {
    filename_local._4_4_ = mem_createmem(0x7080,hdl);
    if (filename_local._4_4_ == 0) {
      filename_local._4_4_ = mem_uncompress2mem(filename,_stdin,*hdl);
      if (filename_local._4_4_ == 0) {
        if (memTable[*hdl].fitsfilesize + 0x100U < *memTable[*hdl].memsizeptr) {
          pcVar1 = (char *)realloc(*memTable[*hdl].memaddrptr,memTable[*hdl].fitsfilesize);
          if (pcVar1 == (char *)0x0) {
            ffpmsg("Failed to reduce size of allocated memory (compress_stdin_open)");
            return 0x71;
          }
          *memTable[*hdl].memaddrptr = pcVar1;
          *memTable[*hdl].memsizeptr = memTable[*hdl].fitsfilesize;
        }
        filename_local._4_4_ = 0;
      }
      else {
        mem_close_free(*hdl);
        ffpmsg("failed to uncompress stdin into memory (compress_stdin_open)");
      }
    }
    else {
      ffpmsg("failed to create empty memory file (compress_stdin_open)");
    }
  }
  else {
    ffpmsg("cannot open compressed input stream with WRITE access (mem_compress_stdin_open)");
    filename_local._4_4_ = 0x70;
  }
  return filename_local._4_4_;
}

Assistant:

int mem_compress_stdin_open(char *filename, int rwmode, int *hdl)
/*
  This routine reads the compressed input stream and creates an empty memory
  buffer, then calls mem_uncompress2mem.
*/
{
    int status;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed input stream with WRITE access (mem_compress_stdin_open)");
        return(READONLY_FILE);
    }
 
    /* create a memory file for the uncompressed file */
    status = mem_createmem(28800, hdl);

    if (status)
    {
        ffpmsg("failed to create empty memory file (compress_stdin_open)");
        return(status);
    }

    /* uncompress file into memory */
    status = mem_uncompress2mem(filename, stdin, *hdl);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to uncompress stdin into memory (compress_stdin_open)");
        return(status);
    }

    /* if we allocated too much memory initially, then free it */
    if (*(memTable[*hdl].memsizeptr) > 
       (( (size_t) memTable[*hdl].fitsfilesize) + 256L) ) 
    {
        ptr = realloc(*(memTable[*hdl].memaddrptr), 
                      ((size_t) memTable[*hdl].fitsfilesize) );
        if (!ptr)
        {
            ffpmsg("Failed to reduce size of allocated memory (compress_stdin_open)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[*hdl].memaddrptr) = ptr;
        *(memTable[*hdl].memsizeptr) = (size_t) (memTable[*hdl].fitsfilesize);
    }

    return(0);
}